

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.hpp
# Opt level: O0

float duckdb::Cast::Operation<duckdb::timestamp_tz_t,float>(timestamp_tz_t input)

{
  bool bVar1;
  string *msg;
  float *in_RDI;
  timestamp_tz_t unaff_retaddr;
  float result;
  timestamp_tz_t in_stack_000001a8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffb4;
  float in_stack_fffffffffffffff4;
  
  bVar1 = TryCast::Operation<duckdb::timestamp_tz_t,float>
                    (unaff_retaddr,in_RDI,SUB41((uint)in_stack_fffffffffffffff4 >> 0x18,0));
  if (!bVar1) {
    uVar2 = CONCAT13(1,(int3)in_stack_ffffffffffffffb0);
    msg = (string *)__cxa_allocate_exception(0x10);
    CastExceptionText<duckdb::timestamp_tz_t,float>(in_stack_000001a8);
    InvalidInputException::InvalidInputException
              ((InvalidInputException *)CONCAT44(in_stack_ffffffffffffffb4,uVar2),msg);
    __cxa_throw(msg,&InvalidInputException::typeinfo,InvalidInputException::~InvalidInputException);
  }
  return in_stack_fffffffffffffff4;
}

Assistant:

static inline DST Operation(SRC input) {
		DST result;
		if (!TryCast::Operation(input, result)) {
			throw InvalidInputException(CastExceptionText<SRC, DST>(input));
		}
		return result;
	}